

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O2

void __thiscall
kj::_::
RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++:357:5)>
::run(RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_twoparty_test_c__:357:5)>
      *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_R8D;
  Own<kj::_::PromiseNode> OStack_58;
  Request<capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsParams,_capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsResults>
  local_48;
  
  capnp::
  Request<capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsParams,_capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsResults>
  ::send(&local_48,(int)(this->func).req,in_RDX,in_RCX,in_R8D);
  Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsResults>_>::
  ignoreResult((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsResults>_>
                *)&OStack_58);
  Promise<void>::wait((Promise<void> *)&OStack_58,((this->func).ioContext)->waitScope);
  Own<kj::_::PromiseNode>::dispose(&OStack_58);
  capnp::RemotePromise<capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsResults>::
  ~RemotePromise((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsResults>
                  *)&local_48);
  return;
}

Assistant:

void run() override {
    func();
  }